

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_unconditional_join.cpp
# Opt level: O1

void __thiscall duckdb::LogicalUnconditionalJoin::ResolveTypes(LogicalUnconditionalJoin *this)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer pLVar2;
  pointer pLVar3;
  reference pvVar4;
  pointer pLVar5;
  
  pvVar1 = &(this->super_LogicalOperator).types;
  pLVar2 = (this->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &(this->super_LogicalOperator).children;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  pLVar3 = (pLVar5->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)pvVar1,pLVar2,pLVar3
             ,(pLVar5->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish);
  pLVar2 = (this->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  pLVar3 = (pLVar5->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)pvVar1,pLVar2,pLVar3
             ,(pLVar5->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void LogicalUnconditionalJoin::ResolveTypes() {
	types.insert(types.end(), children[0]->types.begin(), children[0]->types.end());
	types.insert(types.end(), children[1]->types.begin(), children[1]->types.end());
}